

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,int index)

{
  pointer plVar1;
  layer_creator_func UNRECOVERED_JUMPTABLE;
  Layer *pLVar2;
  
  if (-1 < index) {
    plVar1 = (this->custom_layer_registry).
             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uint)index <
        (ulong)((long)(this->custom_layer_registry).
                      super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)plVar1 >> 4)) {
      UNRECOVERED_JUMPTABLE = plVar1[(uint)index].creator;
      if (UNRECOVERED_JUMPTABLE != (layer_creator_func)0x0) {
        pLVar2 = (*UNRECOVERED_JUMPTABLE)();
        return pLVar2;
      }
    }
  }
  return (Layer *)0x0;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const size_t custom_layer_registry_entry_count = custom_layer_registry.size();
    if (index < 0 || static_cast<unsigned int>(index) >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    return layer_creator();
}